

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * __thiscall
kj::_::Delimited<kj::ArrayPtr<int>_&>::flattenTo
          (Delimited<kj::ArrayPtr<int>_&> *this,char *target,char *limit)

{
  char *limit_00;
  char *target_00;
  int *extraout_RDX;
  int *value;
  int *extraout_RDX_00;
  int *extraout_RDX_01;
  CappedArray<char,_14UL> local_68;
  kj *local_50;
  int *elem;
  int *__end0;
  int *__begin0;
  ArrayPtr<int> *__range3;
  char *pcStack_28;
  bool first;
  char *limit_local;
  char *target_local;
  Delimited<kj::ArrayPtr<int>_&> *this_local;
  
  __range3._7_1_ = 1;
  __begin0 = (int *)this->array;
  pcStack_28 = limit;
  limit_local = target;
  target_local = (char *)this;
  __end0 = ArrayPtr<int>::begin((ArrayPtr<int> *)__begin0);
  elem = ArrayPtr<int>::end((ArrayPtr<int> *)__begin0);
  value = extraout_RDX;
  while ((__end0 != elem && (local_50 = (kj *)__end0, limit_local != pcStack_28))) {
    if ((__range3._7_1_ & 1) == 0) {
      limit_local = fillLimited<kj::StringPtr>(limit_local,pcStack_28,&this->delimiter);
      value = extraout_RDX_00;
    }
    else {
      __range3._7_1_ = 0;
    }
    target_00 = limit_local;
    limit_00 = pcStack_28;
    toCharSequence<int&>(&local_68,local_50,value);
    limit_local = fillLimited<kj::CappedArray<char,14ul>>(target_00,limit_00,&local_68);
    __end0 = __end0 + 1;
    value = extraout_RDX_01;
  }
  return limit_local;
}

Assistant:

char* flattenTo(char* __restrict__ target, char* limit) {
    // This is called in the strPreallocated(). We want to avoid allocation. size() will not have
    // been called in this case, so hopefully `stringified` is still uninitialized. We will
    // stringify each item and immediately use it.
    bool first = true;
    for (auto&& elem: array) {
      if (target == limit) return target;
      if (first) {
        first = false;
      } else {
        target = fillLimited(target, limit, delimiter);
      }
      target = fillLimited(target, limit, kj::toCharSequence(elem));
    }
    return target;
  }